

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::getUserPIN(OSToken *this,ByteString *userPINBlob)

{
  ulong uVar1;
  long in_RDI;
  ByteString *in_stack_ffffffffffffff18;
  OSAttribute *this_00;
  OSAttribute local_b8;
  
  if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
     (uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x50))(), (uVar1 & 1) != 0)) {
    uVar1 = (**(code **)(**(long **)(in_RDI + 0xc0) + 0x10))(*(long **)(in_RDI + 0xc0),0x8000534d);
    if ((uVar1 & 1) == 0) {
      return false;
    }
    this_00 = &local_b8;
    (**(code **)(**(long **)(in_RDI + 0xc0) + 0x18))(this_00,*(long **)(in_RDI + 0xc0),0x8000534d);
    OSAttribute::getByteStringValue(this_00);
    ByteString::operator=((ByteString *)this_00,in_stack_ffffffffffffff18);
    OSAttribute::~OSAttribute(this_00);
    return true;
  }
  return false;
}

Assistant:

bool OSToken::getUserPIN(ByteString& userPINBlob)
{
	if (!valid || !tokenObject->isValid())
	{
		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_USERPIN))
	{
		userPINBlob = tokenObject->getAttribute(CKA_OS_USERPIN).getByteStringValue();

		return true;
	}
	else
	{
		return false;
	}
}